

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb_sdict * stb_sdict_new(int use_arena)

{
  void *local_28;
  stb_sdict *d;
  stb_sdict *psStack_10;
  int use_arena_local;
  
  psStack_10 = stb_sdict_create();
  if (psStack_10 == (stb_sdict *)0x0) {
    psStack_10 = (stb_sdict *)0x0;
  }
  else {
    if (use_arena == 0) {
      local_28 = (void *)0x0;
    }
    else {
      local_28 = stb_malloc_global(1);
    }
    psStack_10->arena = local_28;
  }
  return psStack_10;
}

Assistant:

stb_sdict * stb_sdict_new(int use_arena)
{
   stb_sdict *d = stb_sdict_create();
   if (d == NULL) return NULL;
   d->arena = use_arena ? stb_malloc_global(1) : NULL;
   return d;
}